

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * SyOSHeapAlloc(sxu32 nByte)

{
  void *pvVar1;
  void *pNew;
  sxu32 nByte_local;
  
  pvVar1 = malloc((ulong)nByte);
  return pvVar1;
}

Assistant:

static void * SyOSHeapAlloc(sxu32 nByte)
{
	void *pNew;
#if defined(__WINNT__)
	pNew = HeapAlloc(GetProcessHeap(), 0, nByte);
#else
	pNew = malloc((size_t)nByte);
#endif
	return pNew;
}